

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

void Gia_ManPrintBarBufDrivers(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  uint uVar6;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined7 uVar7;
  uint v;
  bool bVar8;
  int CountFans [2];
  int CountCrit [2];
  
  CountCrit[0] = 0;
  CountCrit[1] = 0;
  CountFans[0] = 0;
  CountFans[1] = 0;
  p_00 = Vec_IntStart(p->nObjs);
  p_01 = Vec_IntStart(p->nObjs);
  p_02 = Vec_IntAlloc(100);
  v = 0;
  while (((int)v < p->nObjs && (pGVar4 = Gia_ManObj(p,v), pGVar4 != (Gia_Obj_t *)0x0))) {
    iVar1 = Gia_ObjIsBuf(pGVar4);
    iVar2 = (int)extraout_RDX;
    uVar6 = (uint)*(ulong *)pGVar4;
    if (iVar1 == 0) {
      uVar7 = (undefined7)((ulong)extraout_RDX >> 8);
      iVar2 = (int)CONCAT71(uVar7,(int)uVar6 < 0);
      uVar5 = *(ulong *)pGVar4 & 0x1fffffff;
      if ((int)uVar6 < 0 && uVar5 != 0x1fffffff) goto LAB_006a9797;
      bVar8 = (int)uVar5 == 0x1fffffff;
      if ((int)uVar6 >= 0 && !bVar8) {
        Vec_IntAddToEntry(p_01,v - (uVar6 & 0x1fffffff),(int)CONCAT71(uVar7,(int)uVar6 < 0 || bVar8)
                         );
        uVar6 = *(uint *)&pGVar4->field_0x4;
        iVar2 = extraout_EDX;
        goto LAB_006a9797;
      }
    }
    else {
LAB_006a9797:
      Vec_IntAddToEntry(p_01,v - (uVar6 & 0x1fffffff),iVar2);
    }
    iVar2 = Gia_ObjIsBuf(pGVar4);
    if (iVar2 != 0) {
      uVar6 = *(uint *)pGVar4;
      iVar2 = v - (uVar6 & 0x1fffffff);
      if ((iVar2 == 0) || (iVar1 = Vec_IntEntry(p_00,iVar2), iVar1 != 0)) {
        CountCrit[v != (uVar6 & 0x1fffffff)] = CountCrit[v != (uVar6 & 0x1fffffff)] + 1;
        Vec_IntPush(p_02,v);
      }
      else {
        iVar1 = Abc_Var2Lit(v,*(uint *)pGVar4 >> 0x1d & 1);
        Vec_IntWriteEntry(p_00,iVar2,iVar1);
      }
    }
    v = v + 1;
  }
  iVar2 = p_02->nSize;
  for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
    iVar3 = Vec_IntEntry(p_02,iVar1);
    pGVar4 = Gia_ManObj(p,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjIsBuf(pGVar4);
    if (iVar3 == 0) {
      __assert_fail("Gia_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                    ,0xf8,"void Gia_ManPrintBarBufDrivers(Gia_Man_t *)");
    }
    iVar3 = Vec_IntEntry(p_01,iVar1);
    if (iVar3 != 0) {
      iVar3 = Gia_ObjFaninId0p(p,pGVar4);
      CountFans[iVar3 != 0] = CountFans[iVar3 != 0] + 1;
    }
  }
  printf("Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n",
         (ulong)CountFans & 0xffffffff,(ulong)CountCrit & 0xffffffff,(ulong)CountFans >> 0x20,
         (ulong)CountCrit >> 0x20);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return;
}

Assistant:

void Gia_ManPrintBarBufDrivers( Gia_Man_t * p )
{
    Vec_Int_t * vMap, * vFan, * vCrits;
    Gia_Obj_t * pObj;
    int i, iFanin, CountCrit[2] = {0}, CountFans[2] = {0};
    // map barbuf drivers into barbuf literals of the first barbuf driven by them
    vMap = Vec_IntStart( Gia_ManObjNum(p) );
    vFan = Vec_IntStart( Gia_ManObjNum(p) );
    vCrits = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        // count fanouts
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjIsCo(pObj) )
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId1(pObj, i), 1 );
        }
        // count critical barbufs
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0( pObj, i );
            if ( iFanin == 0 || Vec_IntEntry(vMap, iFanin) != 0 )
            {
                CountCrit[(int)(iFanin != 0)]++;
                Vec_IntPush( vCrits, i );
                continue;
            }
            Vec_IntWriteEntry( vMap, iFanin, Abc_Var2Lit(i, Gia_ObjFaninC0(pObj)) );
        }
    }
    // check fanouts of the critical barbufs
    Gia_ManForEachObjVec( vCrits, p, pObj, i )
    {
        assert( Gia_ObjIsBuf(pObj) );
        if ( Vec_IntEntry(vFan, i) == 0 )
            continue;
        iFanin = Gia_ObjFaninId0p( p, pObj );
        CountFans[(int)(iFanin != 0)]++;
    }
    printf( "Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n", 
        CountFans[0], CountCrit[0], CountFans[1], CountCrit[1] );
    Vec_IntFree( vMap );
    Vec_IntFree( vFan );
    Vec_IntFree( vCrits );
}